

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::GLMClassifier::Clear(GLMClassifier *this)

{
  GLMClassifier *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::Clear
            (&this->weights_);
  google::protobuf::RepeatedField<double>::Clear(&this->offset_);
  memset(&this->postevaluationtransform_,0,8);
  clear_ClassLabels(this);
  return;
}

Assistant:

void GLMClassifier::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.GLMClassifier)
  weights_.Clear();
  offset_.Clear();
  ::memset(&postevaluationtransform_, 0, reinterpret_cast<char*>(&classencoding_) -
    reinterpret_cast<char*>(&postevaluationtransform_) + sizeof(classencoding_));
  clear_ClassLabels();
}